

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O0

bool vk::isDebugReportSupported(PlatformInterface *vkp)

{
  bool bVar1;
  Maybe<unsigned_int> local_c0;
  Maybe<unsigned_int> local_b0 [2];
  allocator<char> local_89;
  string local_88;
  RequiredExtension local_68;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_28;
  PlatformInterface *local_10;
  PlatformInterface *vkp_local;
  
  local_10 = vkp;
  enumerateInstanceExtensionProperties(&local_28,vkp,(char *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"VK_EXT_debug_report",&local_89);
  tcu::nothing<unsigned_int>();
  tcu::nothing<unsigned_int>();
  RequiredExtension::RequiredExtension(&local_68,&local_88,local_b0,&local_c0);
  bVar1 = isExtensionSupported(&local_28,&local_68);
  RequiredExtension::~RequiredExtension(&local_68);
  tcu::Maybe<unsigned_int>::~Maybe(&local_c0);
  tcu::Maybe<unsigned_int>::~Maybe(local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            (&local_28);
  return bVar1;
}

Assistant:

bool isDebugReportSupported (const PlatformInterface& vkp)
{
	return isExtensionSupported(enumerateInstanceExtensionProperties(vkp, DE_NULL),
								RequiredExtension("VK_EXT_debug_report"));
}